

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.hpp
# Opt level: O2

void __thiscall
function<void_(int)>::function(function<void_(int)> *this,function<void_(int)> *other)

{
  vtable *pvVar1;
  
  this->vtable_ = (vtable *)0x0;
  pvVar1 = other->vtable_;
  this->vtable_ = pvVar1;
  if (pvVar1 != (vtable *)0x0) {
    (*pvVar1->move)(other,this);
    if (other->vtable_ != (vtable *)0x0) {
      (*other->vtable_->destroy)(other);
      other->vtable_ = (vtable *)0x0;
    }
  }
  return;
}

Assistant:

function<R(Args...)>::function (function && other) noexcept
{
	vtable_ = other.vtable_;
	if (vtable_)
		vtable_->move(&other.storage_, &storage_);
	other.reset();
}